

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::beckmann::cdf2(beckmann *this,float_t tx,float_t zi,float_t z_i)

{
  float extraout_XMM0_Da;
  float fVar1;
  float fVar2;
  
  (*(this->super_radial).super_microfacet.super_brdf._vptr_brdf[0xf])(zi);
  fVar1 = expf(-tx * tx);
  fVar2 = erff(tx);
  return ((fVar2 + 1.0) * zi * 0.5 + (fVar1 * z_i) / 3.5449078) / extraout_XMM0_Da;
}

Assistant:

float_t beckmann::cdf2(float_t tx, float_t zi, float_t z_i) const
{
	float_t sigma_i = sigma_std_radial(zi);
	float_t tmp1 = z_i * exp(-sqr(tx)) / (2 * sqrt(m_pi()));
	float_t tmp2 = zi * (std::erf(tx) + 1) / 2;

	return (tmp1 + tmp2) / sigma_i;
}